

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::performPass(QualifiedIdentifierResolver *this)

{
  ASTVisitor local_30;
  void *local_28;
  undefined8 uStack_20;
  long local_18;
  
  RewritingASTVisitor::visitObject
            ((RewritingASTVisitor *)this,
             (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.module);
  if (this->numVariablesResolved != 0) {
    local_30._vptr_ASTVisitor = (_func_int **)&PTR__RecursiveVariableInitialiserCheck_002f85d0;
    local_28 = (void *)0x0;
    uStack_20 = 0;
    local_18 = 0;
    ASTVisitor::visitObject
              (&local_30,
               (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.module);
    local_30._vptr_ASTVisitor = (_func_int **)&PTR__RecursiveVariableInitialiserCheck_002f85d0;
    if (local_28 != (void *)0x0) {
      operator_delete(local_28,local_18 - (long)local_28);
    }
  }
  return;
}

Assistant:

void performPass()
        {
            super::performPass();

            if (numVariablesResolved > 0)
            {
                struct RecursiveVariableInitialiserCheck  : public ASTVisitor
                {
                    void visit (AST::VariableDeclaration& v) override
                    {
                        if (contains (stack, pool_ptr<AST::VariableDeclaration> (v)))
                            v.context.throwError (Errors::initialiserRefersToTarget (v.name));

                        if (v.initialValue != nullptr)
                            stack.push_back (v);

                        ASTVisitor::visit (v);

                        if (v.initialValue != nullptr)
                            stack.pop_back();
                    }

                    void visit (AST::VariableRef& vr) override
                    {
                        visit (vr.variable);
                    }

                    std::vector<pool_ref<AST::VariableDeclaration>> stack;
                };

                RecursiveVariableInitialiserCheck().visitObject (module);
            }
        }